

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O0

double __thiscall IF97::Backwards::BackwardsRegion::t_hs(BackwardsRegion *this,double h,double s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  const_reference pvVar4;
  double dVar5;
  double dVar6;
  ulong local_40;
  size_t i;
  double summer;
  double sigma;
  double eta;
  double s_local;
  double h_local;
  BackwardsRegion *this_local;
  
  dVar1 = this->h_star;
  dVar2 = this->s_star;
  i = 0;
  for (local_40 = 0; local_40 < this->N; local_40 = local_40 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->n,local_40);
    dVar3 = *pvVar4;
    dVar6 = this->a;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->I,local_40);
    dVar5 = pow(h / dVar1 + dVar6,*pvVar4);
    dVar6 = this->b;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->J,local_40);
    dVar6 = pow(s / dVar2 + dVar6,*pvVar4);
    i = (size_t)(dVar3 * dVar5 * dVar6 + (double)i);
  }
  return (double)i * this->T_star;
}

Assistant:

virtual double t_hs(double h, double s) const{
                const double eta = h/h_star, sigma = s/s_star;
                double summer = 0;
                for (std::size_t i = 0; i < N; ++i){
                    summer += n[i]*std::pow(eta+a, I[i])*std::pow(sigma+b, J[i]);
                }
                return summer*T_star;
            }